

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void g_numbox_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("nbx");
  my_numbox_class = class_new(ptVar2,my_numbox_new,my_numbox_free,0x4f0,0,A_GIMME,0);
  ptVar2 = gensym("my_numbox");
  class_addcreator(my_numbox_new,ptVar2,A_GIMME,0);
  class_addbang(my_numbox_class,my_numbox_bang);
  class_doaddfloat(my_numbox_class,my_numbox_float);
  class_addlist(my_numbox_class,my_numbox_list);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("click");
  class_addmethod(p_Var1,my_numbox_click,ptVar2,A_FLOAT,1,1,1,1,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("motion");
  class_addmethod(p_Var1,my_numbox_motion,ptVar2,A_FLOAT,1,6,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("dialog");
  class_addmethod(p_Var1,my_numbox_dialog,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("loadbang");
  class_addmethod(p_Var1,my_numbox_loadbang,ptVar2,A_DEFFLOAT,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,my_numbox_set,ptVar2,A_FLOAT,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("size");
  class_addmethod(p_Var1,my_numbox_size,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("delta");
  class_addmethod(p_Var1,my_numbox_delta,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("pos");
  class_addmethod(p_Var1,my_numbox_pos,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("range");
  class_addmethod(p_Var1,my_numbox_range,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,my_numbox_color,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("send");
  class_addmethod(p_Var1,my_numbox_send,ptVar2,A_DEFSYM,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("receive");
  class_addmethod(p_Var1,my_numbox_receive,ptVar2,A_DEFSYM,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("label");
  class_addmethod(p_Var1,my_numbox_label,ptVar2,A_DEFSYM,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("label_pos");
  class_addmethod(p_Var1,my_numbox_label_pos,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("label_font");
  class_addmethod(p_Var1,my_numbox_label_font,ptVar2,A_GIMME,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("log");
  class_addmethod(p_Var1,my_numbox_log,ptVar2,A_NULL);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("lin");
  class_addmethod(p_Var1,my_numbox_lin,ptVar2,A_NULL);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("init");
  class_addmethod(p_Var1,my_numbox_init,ptVar2,A_FLOAT,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("log_height");
  class_addmethod(p_Var1,my_numbox_log_height,ptVar2,A_FLOAT,0);
  p_Var1 = my_numbox_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,iemgui_zoom,ptVar2,A_CANT,0);
  my_numbox_widgetbehavior.w_getrectfn = my_numbox_getrect;
  my_numbox_widgetbehavior.w_displacefn = iemgui_displace;
  my_numbox_widgetbehavior.w_selectfn = iemgui_select;
  my_numbox_widgetbehavior.w_activatefn = (t_activatefn)0x0;
  my_numbox_widgetbehavior.w_deletefn = iemgui_delete;
  my_numbox_widgetbehavior.w_visfn = iemgui_vis;
  my_numbox_widgetbehavior.w_clickfn = my_numbox_newclick;
  class_setwidget(my_numbox_class,&my_numbox_widgetbehavior);
  class_setsavefn(my_numbox_class,my_numbox_save);
  class_setpropertiesfn(my_numbox_class,my_numbox_properties);
  return;
}

Assistant:

void g_numbox_setup(void)
{
    my_numbox_class = class_new(gensym("nbx"), (t_newmethod)my_numbox_new,
        (t_method)my_numbox_free, sizeof(t_my_numbox), 0, A_GIMME, 0);
    class_addcreator((t_newmethod)my_numbox_new, gensym("my_numbox"), A_GIMME, 0);
    class_addbang(my_numbox_class, my_numbox_bang);
    class_addfloat(my_numbox_class, my_numbox_float);
    class_addlist(my_numbox_class, my_numbox_list);
    class_addmethod(my_numbox_class, (t_method)my_numbox_click,
        gensym("click"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_motion,
        gensym("motion"), A_FLOAT, A_FLOAT, A_DEFFLOAT, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_dialog,
        gensym("dialog"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_loadbang,
        gensym("loadbang"), A_DEFFLOAT, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_set,
        gensym("set"), A_FLOAT, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_size,
        gensym("size"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_delta,
        gensym("delta"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_pos,
        gensym("pos"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_range,
        gensym("range"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_color,
        gensym("color"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_send,
        gensym("send"), A_DEFSYM, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_receive,
        gensym("receive"), A_DEFSYM, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_label,
        gensym("label"), A_DEFSYM, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_label_pos,
        gensym("label_pos"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_label_font,
        gensym("label_font"), A_GIMME, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_log,
        gensym("log"), 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_lin,
        gensym("lin"), 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_init,
        gensym("init"), A_FLOAT, 0);
    class_addmethod(my_numbox_class, (t_method)my_numbox_log_height,
        gensym("log_height"), A_FLOAT, 0);
    class_addmethod(my_numbox_class, (t_method)iemgui_zoom,
        gensym("zoom"), A_CANT, 0);
    my_numbox_widgetbehavior.w_getrectfn =    my_numbox_getrect;
    my_numbox_widgetbehavior.w_displacefn =   iemgui_displace;
    my_numbox_widgetbehavior.w_selectfn =     iemgui_select;
    my_numbox_widgetbehavior.w_activatefn =   NULL;
    my_numbox_widgetbehavior.w_deletefn =     iemgui_delete;
    my_numbox_widgetbehavior.w_visfn =        iemgui_vis;
    my_numbox_widgetbehavior.w_clickfn =      my_numbox_newclick;
    class_setwidget(my_numbox_class, &my_numbox_widgetbehavior);
    class_setsavefn(my_numbox_class, my_numbox_save);
    class_setpropertiesfn(my_numbox_class, my_numbox_properties);
}